

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e2etest.cc
# Opt level: O0

void * compact_thread(void *args)

{
  fdb_file_handle *dbfile;
  fdb_config *fconfig;
  int i;
  fdb_config *in_stack_000001f8;
  char *in_stack_00000200;
  fdb_file_handle **in_stack_00000208;
  fdb_file_handle *in_stack_ffffffffffffffd8;
  fdb_file_handle *in_stack_ffffffffffffffe0;
  undefined4 local_c;
  
  fdb_open(in_stack_00000208,in_stack_00000200,in_stack_000001f8);
  for (local_c = 0; local_c < 3; local_c = local_c + 1) {
    sleep(2);
    fdb_compact(in_stack_ffffffffffffffe0,(char *)in_stack_ffffffffffffffd8);
  }
  fdb_close(in_stack_ffffffffffffffd8);
  return (void *)0x0;
}

Assistant:

void *compact_thread(void *args) {
    int i;
    fdb_config *fconfig = (fdb_config *)args;
    fdb_file_handle *dbfile;
    fdb_open(&dbfile, E2EDB_MAIN, fconfig);
    for (i = 0; i < 3; ++i) {
        sleep(2);
#ifdef __DEBUG_E2E
        printf("compact: %d\n", i);
#endif
        fdb_compact(dbfile, NULL);
    }
    fdb_close(dbfile);
    return NULL;
}